

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool picojson::
     _parse<picojson::default_parse_context,boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
               (default_parse_context *ctx,
               input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *in)

{
  input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this;
  bool bVar1;
  ulong uVar2;
  char *__nptr;
  long lVar3;
  long lVar4;
  FILE *__stream;
  input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *in_00;
  double f_00;
  bool local_12a;
  bool local_112;
  bool local_fa;
  undefined1 local_e0 [8];
  string num_str;
  char *endp;
  double f;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  int local_24;
  input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *piStack_20;
  int ch;
  input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *in_local;
  default_parse_context *ctx_local;
  
  piStack_20 = in;
  in_local = (input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *)ctx;
  input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::skip_ws(in);
  local_24 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::getc
                       (piStack_20,(FILE *)in);
  this = piStack_20;
  if (local_24 == 0x22) {
    ctx_local._7_1_ =
         default_parse_context::
         parse_string<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
                   ((default_parse_context *)in_local,piStack_20);
  }
  else if (local_24 == 0x5b) {
    ctx_local._7_1_ =
         _parse_array<picojson::default_parse_context,boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
                   ((default_parse_context *)in_local,piStack_20);
  }
  else if (local_24 == 0x66) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,"alse",&local_81);
    bVar1 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::match
                      (this,&local_80);
    local_112 = false;
    if (bVar1) {
      local_112 = default_parse_context::set_bool((default_parse_context *)in_local,false);
    }
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    if (local_112 == false) {
      ctx_local._7_1_ = 0;
    }
    else {
      ctx_local._7_1_ = 1;
    }
  }
  else if (local_24 == 0x6e) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"ull",&local_49);
    bVar1 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::match
                      (this,&local_48);
    local_fa = false;
    if (bVar1) {
      local_fa = default_parse_context::set_null((default_parse_context *)in_local);
    }
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if (local_fa == false) {
      ctx_local._7_1_ = 0;
    }
    else {
      ctx_local._7_1_ = 1;
    }
  }
  else if (local_24 == 0x74) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a8,"rue",(allocator *)((long)&f + 7));
    bVar1 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::match
                      (this,&local_a8);
    local_12a = false;
    if (bVar1) {
      local_12a = default_parse_context::set_bool((default_parse_context *)in_local,true);
    }
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&f + 7));
    if (local_12a == false) {
      ctx_local._7_1_ = 0;
    }
    else {
      ctx_local._7_1_ = 1;
    }
  }
  else if (local_24 == 0x7b) {
    ctx_local._7_1_ =
         _parse_object<picojson::default_parse_context,boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
                   ((default_parse_context *)in_local,piStack_20);
  }
  else if (((local_24 < 0x30) || (0x39 < local_24)) && (local_24 != 0x2d)) {
    input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::ungetc
              (piStack_20,(int)in,__stream);
    ctx_local._7_1_ = 0;
  }
  else {
    input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::ungetc
              (piStack_20,(int)in,__stream);
    _parse_number<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
              ((string *)local_e0,(picojson *)piStack_20,in_00);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      __nptr = (char *)std::__cxx11::string::c_str();
      f_00 = strtod(__nptr,(char **)((long)&num_str.field_2 + 8));
      lVar3 = std::__cxx11::string::c_str();
      lVar4 = std::__cxx11::string::size();
      if (num_str.field_2._8_8_ == lVar3 + lVar4) {
        default_parse_context::set_number((default_parse_context *)in_local,f_00);
        ctx_local._7_1_ = 1;
      }
      else {
        ctx_local._7_1_ = 0;
      }
    }
    else {
      ctx_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_e0);
  }
  return (bool)(ctx_local._7_1_ & 1);
}

Assistant:

inline bool _parse(Context& ctx, input<Iter>& in) {
    in.skip_ws();
    int ch = in.getc();
    switch (ch) {
#define IS(ch, text, op) case ch: \
      if (in.match(text) && op) { \
	return true; \
      } else { \
	return false; \
      }
      IS('n', "ull", ctx.set_null());
      IS('f', "alse", ctx.set_bool(false));
      IS('t', "rue", ctx.set_bool(true));
#undef IS
    case '"':
      return ctx.parse_string(in);
    case '[':
      return _parse_array(ctx, in);
    case '{':
      return _parse_object(ctx, in);
    default:
      if (('0' <= ch && ch <= '9') || ch == '-') {
        double f;
        char *endp;
	in.ungetc();
        std::string num_str = _parse_number(in);
        if (num_str.empty()) {
          return false;
        }
#ifdef PICOJSON_USE_INT64
        {
          errno = 0;
          intmax_t ival = strtoimax(num_str.c_str(), &endp, 10);
          if (errno == 0
              && std::numeric_limits<int64_t>::min() <= ival
              && ival <= std::numeric_limits<int64_t>::max()
              && endp == num_str.c_str() + num_str.size()) {
            ctx.set_int64(ival);
            return true;
          }
        }
#endif
        f = strtod(num_str.c_str(), &endp);
        if (endp == num_str.c_str() + num_str.size()) {
          ctx.set_number(f);
          return true;
        }
        return false;
      }
      break;
    }
    in.ungetc();
    return false;
  }